

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O3

bool __thiscall bssl::anon_unknown_0::IsSequenceTLV(anon_unknown_0 *this,Input input)

{
  bool bVar1;
  Input input_00;
  Parser parser;
  Parser unused_sequence_parser;
  Parser local_40;
  Parser local_28;
  
  input_00.data_.size_ = (size_t)input.data_.data_;
  input_00.data_.data_ = (uchar *)this;
  bssl::der::Parser::Parser(&local_40,input_00);
  bssl::der::Parser::Parser(&local_28);
  bVar1 = bssl::der::Parser::ReadSequence(&local_40,&local_28);
  if (bVar1) {
    bVar1 = bssl::der::Parser::HasMore(&local_40);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

[[nodiscard]] bool IsSequenceTLV(der::Input input) {
  der::Parser parser(input);
  der::Parser unused_sequence_parser;
  if (!parser.ReadSequence(&unused_sequence_parser)) {
    return false;
  }
  // Should by a single SEQUENCE by definition of the function.
  return !parser.HasMore();
}